

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall
CCheckQueue<CScriptCheck>::Add
          (CCheckQueue<CScriptCheck> *this,
          vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *vChecks)

{
  long lVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((vChecks->
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (vChecks->
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock2,&this->m_mutex,"m_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/checkqueue.h"
               ,0xa3,false);
    std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>,void>
              ((vector<CScriptCheck,std::allocator<CScriptCheck>> *)&this->queue,
               (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
               .super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>_>
                )(vChecks->
                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck_*,_std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>_>_>
                )(vChecks->
                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    this->nTodo = this->nTodo +
                  (int)(((long)(vChecks->
                               super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(vChecks->
                              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x50);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    if ((long)(vChecks->
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(vChecks->
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x50) {
      std::condition_variable::notify_one();
    }
    else {
      std::condition_variable::notify_all();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        if (vChecks.empty()) {
            return;
        }

        {
            LOCK(m_mutex);
            queue.insert(queue.end(), std::make_move_iterator(vChecks.begin()), std::make_move_iterator(vChecks.end()));
            nTodo += vChecks.size();
        }

        if (vChecks.size() == 1) {
            m_worker_cv.notify_one();
        } else {
            m_worker_cv.notify_all();
        }
    }